

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauGia.c
# Opt level: O3

int Dau_DsdToGia_rec(Gia_Man_t *pGia,char *pStr,char **p,int *pMatches,int *pLits,Vec_Int_t *vCover)

{
  Gia_Obj_t *pGVar1;
  byte bVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *pVVar4;
  byte *pbVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  byte *pbVar10;
  int iVar11;
  uint uVar12;
  char *pcVar13;
  Gia_Obj_t *pGVar14;
  ulong uVar15;
  long lVar16;
  char *pcVar17;
  byte *pbVar18;
  ulong uVar19;
  int iVar20;
  int Temp [3];
  Vec_Int_t vLeaves;
  int pFans [12];
  int local_278 [12];
  Vec_Int_t local_248;
  word local_238 [65];
  
  pbVar18 = (byte *)*p;
  bVar2 = *pbVar18;
  bVar6 = bVar2;
  if (bVar2 == 0x21) {
    *p = (char *)(pbVar18 + 1);
    pbVar10 = pbVar18 + 1;
    pbVar18 = pbVar18 + 1;
    bVar6 = *pbVar10;
  }
  if ((byte)(bVar6 + 0x9f) < 0xc) {
    uVar8 = pLits[(ulong)bVar6 - 0x61];
  }
  else if (bVar6 == 0x5b) {
    if (pStr[pMatches[(long)pbVar18 - (long)pStr]] != ']') {
      __assert_fail("**p == \'[\' && *q == \']\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                    ,0x123,
                    "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)")
      ;
    }
    pbVar10 = (byte *)(pStr + pMatches[(long)pbVar18 - (long)pStr]);
    *p = (char *)(pbVar18 + 1);
    iVar20 = 0;
    if (pbVar18 + 1 < pbVar10) {
      iVar11 = 0;
      do {
        iVar7 = Dau_DsdToGia_rec(pGia,pStr,p,pMatches,pLits,vCover);
        iVar20 = iVar11 + 1;
        Dau_DsdAddToArray(pGia,(int *)local_238,iVar11,iVar7);
        pcVar17 = *p;
        *p = pcVar17 + 1;
        iVar11 = iVar20;
      } while (pcVar17 + 1 < pbVar10);
    }
    uVar8 = Dau_DsdBalance(pGia,(int *)local_238,iVar20,0);
    if ((byte *)*p != pbVar10) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                    ,0x12a,
                    "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)")
      ;
    }
  }
  else {
    if (bVar6 == 0x3c) {
      lVar16 = (long)pMatches[(long)pbVar18 - (long)pStr];
      uVar8 = 0;
      if (pStr[lVar16 + 1] == '{') {
        pcVar17 = pStr + lVar16 + 1;
        *p = pcVar17;
        if ((*pcVar17 != '{') ||
           (pcVar17 = pStr + pMatches[(long)pcVar17 - (long)pStr], *pcVar17 != '}')) {
          __assert_fail("**p == \'{\' && *q2 == \'}\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                        ,0x13b,
                        "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        pcVar13 = pStr + lVar16 + 2;
        *p = pcVar13;
        lVar16 = 0;
        if (pcVar13 < pcVar17) {
          lVar16 = 0;
          do {
            iVar20 = Dau_DsdToGia_rec(pGia,pStr,p,pMatches,pLits,vCover);
            *(int *)((long)local_238 + lVar16 * 4) = iVar20;
            pcVar13 = *p + 1;
            *p = pcVar13;
            lVar16 = lVar16 + 1;
          } while (pcVar13 < pcVar17);
        }
        uVar8 = (uint)lVar16;
        if (pcVar13 != pcVar17) {
          __assert_fail("*p == q2",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                        ,0x13e,
                        "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        lVar16 = (long)pMatches[(long)pbVar18 - (long)pStr];
        pLits = (int *)local_238;
      }
      *p = (char *)pbVar18;
      if ((*pbVar18 != 0x3c) || (pbVar10 = (byte *)(pStr + lVar16), *pbVar10 != 0x3e)) {
        __assert_fail("**p == \'<\' && *q == \'>\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                      ,0x146,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      pbVar5 = pbVar18;
      if (uVar8 != 0) {
        for (; pbVar5 < pbVar10; pbVar5 = pbVar5 + 1) {
          if (((byte)(*pbVar5 + 0x9f) < 0x1a) && (uVar8 <= (byte)(*pbVar5 + 0x9f))) {
            __assert_fail("*pOld - \'a\' < nVars",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                          ,0x14b,
                          "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                         );
          }
        }
      }
      *p = (char *)(pbVar18 + 1);
      if (pbVar10 <= pbVar18 + 1) {
LAB_004c4f43:
        __assert_fail("pTemp == Temp + 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                      ,0x14f,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      lVar16 = 0;
      do {
        iVar20 = Dau_DsdToGia_rec(pGia,pStr,p,pMatches,pLits,vCover);
        *(int *)((long)local_278 + lVar16) = iVar20;
        lVar16 = lVar16 + 4;
        pcVar17 = *p;
        pbVar18 = (byte *)(pcVar17 + 1);
        *p = (char *)pbVar18;
      } while (pbVar18 < pbVar10);
      if (lVar16 != 0xc) goto LAB_004c4f43;
      if (pbVar18 != pbVar10) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                      ,0x150,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      if (pbVar10[1] == 0x7b) {
        *p = pcVar17 + 2;
        if ((pcVar17[2] != '{') || (pStr[pMatches[(long)(pcVar17 + 2) - (long)pStr]] != '}')) {
          __assert_fail("**p == \'{\' && *q == \'}\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                        ,0x154,
                        "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        *p = pStr + pMatches[(long)(pcVar17 + 2) - (long)pStr];
      }
      if (pGia->pMuxes == (uint *)0x0) {
        uVar8 = Gia_ManHashMux(pGia,local_278[0],local_278[1],local_278[2]);
      }
      else {
        uVar8 = Gia_ManHashMuxReal(pGia,local_278[0],local_278[1],local_278[2]);
      }
      if ((int)uVar8 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf2,"int Abc_Lit2Var(int)");
      }
      uVar9 = uVar8 >> 1;
      if (pGia->nObjs <= (int)uVar9) {
LAB_004c4e2c:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar19 = *(ulong *)(pGia->pObjs + uVar9);
      uVar15 = uVar19 & 0x1fffffff;
      if (uVar15 != 0x1fffffff && -1 < (int)uVar19) {
        pGVar1 = pGia->pObjs + uVar9;
        if (pGia->pMuxes == (uint *)0x0) {
          if ((~*(uint *)(pGVar1 + -uVar15) & 0x1fffffff) != 0 &&
              -1 < (int)*(uint *)(pGVar1 + -uVar15)) {
            Gia_ObjSetAndLevel(pGia,pGVar1 + -uVar15);
            uVar19 = *(ulong *)pGVar1;
          }
          uVar19 = (ulong)((uint)(uVar19 >> 0x20) & 0x1fffffff);
          if ((~*(uint *)(pGVar1 + -uVar19) & 0x1fffffff) != 0 &&
              -1 < (int)*(uint *)(pGVar1 + -uVar19)) {
            Gia_ObjSetAndLevel(pGia,pGVar1 + -uVar19);
          }
          Gia_ObjSetAndLevel(pGia,pGVar1);
        }
        else {
          Gia_ObjSetMuxLevel(pGia,pGVar1);
        }
      }
      goto LAB_004c4e13;
    }
    if (bVar6 == 0x28) {
      if (pStr[pMatches[(long)pbVar18 - (long)pStr]] != ')') {
        __assert_fail("**p == \'(\' && *q == \')\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                      ,0x115,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      pbVar10 = (byte *)(pStr + pMatches[(long)pbVar18 - (long)pStr]);
      *p = (char *)(pbVar18 + 1);
      iVar20 = 0;
      if (pbVar18 + 1 < pbVar10) {
        iVar11 = 0;
        do {
          iVar7 = Dau_DsdToGia_rec(pGia,pStr,p,pMatches,pLits,vCover);
          iVar20 = iVar11 + 1;
          Dau_DsdAddToArray(pGia,(int *)local_238,iVar11,iVar7);
          pcVar17 = *p;
          *p = pcVar17 + 1;
          iVar11 = iVar20;
        } while (pcVar17 + 1 < pbVar10);
      }
      uVar8 = Dau_DsdBalance(pGia,(int *)local_238,iVar20,1);
      if ((byte *)*p != pbVar10) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                      ,0x11c,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
    }
    else {
      if (5 < (byte)(bVar6 + 0xbf) && 9 < (byte)(bVar6 - 0x30)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                      ,0x184,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      iVar20 = Abc_TtReadHex(local_238,(char *)pbVar18);
      iVar11 = 1 << ((char)iVar20 - 2U & 0x1f);
      if (iVar20 < 3) {
        iVar11 = 1;
      }
      pcVar13 = *p;
      pcVar17 = pcVar13 + iVar11;
      *p = pcVar17;
      if ((pcVar13[iVar11] != '{') ||
         (pcVar13 = pStr + pMatches[(long)pcVar17 - (long)pStr], *pcVar13 != '}')) {
        __assert_fail("**p == \'{\' && *q == \'}\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                      ,0x173,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      pcVar17 = pcVar17 + 1;
      *p = pcVar17;
      lVar16 = 0;
      if (pcVar17 < pcVar13) {
        lVar16 = 0;
        do {
          iVar11 = Dau_DsdToGia_rec(pGia,pStr,p,pMatches,pLits,vCover);
          local_278[lVar16] = iVar11;
          pcVar17 = *p + 1;
          *p = pcVar17;
          lVar16 = lVar16 + 1;
        } while (pcVar17 < pcVar13);
      }
      if ((int)lVar16 != iVar20) {
        __assert_fail("i == nVars",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                      ,0x176,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      if (pcVar17 != pcVar13) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                      ,0x177,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      local_248.pArray = local_278;
      uVar9 = pGia->nObjs;
      uVar19 = (ulong)uVar9;
      local_248.nCap = iVar20;
      local_248.nSize = iVar20;
      uVar8 = Kit_TruthToGia(pGia,(uint *)local_238,iVar20,vCover,&local_248,1);
      iVar20 = pGia->nObjs;
      if ((int)uVar9 < iVar20) {
        lVar16 = uVar19 * 0xc;
        do {
          if ((int)uVar9 < 0) goto LAB_004c4e2c;
          pGVar3 = pGia->pObjs;
          pGVar1 = (Gia_Obj_t *)(&pGVar3->field_0x0 + lVar16);
          if (pGia->fGiaSimple == 0) {
            uVar15 = *(ulong *)pGVar1;
            if ((((int)(uint)uVar15 < 0) ||
                (uVar12 = (uint)uVar15 & 0x1fffffff, uVar12 == 0x1fffffff)) ||
               (uVar12 != ((uint)(uVar15 >> 0x20) & 0x1fffffff))) goto LAB_004c4b59;
            if ((uVar15 & 0x1fffffff) == 0x1fffffff) {
              __assert_fail("Gia_ObjIsAnd(pObj)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x219,"void Gia_ObjSetBufLevel(Gia_Man_t *, Gia_Obj_t *)");
            }
            iVar11 = (int)(uVar15 & 0x1fffffff);
            pGVar14 = (Gia_Obj_t *)(lVar16 + (ulong)(uint)(iVar11 * 4) * -3 + (long)pGVar3);
            if ((pGVar14 < pGVar3) || (pGVar3 + iVar20 <= pGVar14)) {
LAB_004c4e6a:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            uVar12 = (int)((long)(lVar16 + (ulong)(uint)(iVar11 << 2) * -3) >> 2) * -0x55555555;
            pVVar4 = pGia->vLevels;
            Vec_IntFillExtra(pVVar4,uVar12 + 1,(int)pGVar14);
            if (((int)uVar12 < 0) || (pVVar4->nSize <= (int)uVar12)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            pGVar14 = pGia->pObjs;
            if ((pGVar1 < pGVar14) || (pGVar14 + pGia->nObjs <= pGVar1)) goto LAB_004c4e6a;
            iVar20 = pVVar4->pArray[uVar12 & 0x7fffffff];
            uVar12 = (int)((long)pGVar3 + (lVar16 - (long)pGVar14) >> 2) * -0x55555555;
            pVVar4 = pGia->vLevels;
            Vec_IntFillExtra(pVVar4,uVar12 + 1,(int)pGVar1);
            if (((int)uVar12 < 0) || (pVVar4->nSize <= (int)uVar12)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            pVVar4->pArray[uVar12 & 0x7fffffff] = iVar20;
          }
          else {
LAB_004c4b59:
            if ((pGia->pMuxes == (uint *)0x0) || (pGia->pMuxes[uVar19] == 0)) {
              uVar12 = (uint)*(undefined8 *)pGVar1;
              if ((~uVar12 & 0x1fffffff) != 0 && -1 < (int)uVar12) {
                if ((uVar12 & 0x1fffffff) <
                    ((uint)((ulong)*(undefined8 *)pGVar1 >> 0x20) & 0x1fffffff)) {
                  Gia_ObjSetXorLevel(pGia,pGVar1);
                }
                else {
                  Gia_ObjSetAndLevel(pGia,pGVar1);
                }
              }
            }
            else {
              Gia_ObjSetMuxLevel(pGia,pGVar1);
            }
          }
          uVar19 = uVar19 + 1;
          iVar20 = pGia->nObjs;
          lVar16 = lVar16 + 0xc;
        } while ((int)uVar19 < iVar20);
      }
      m_Non1Step = m_Non1Step + 1;
    }
  }
  if ((int)uVar8 < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                  ,0xf5,"int Abc_LitNotCond(int, int)");
  }
LAB_004c4e13:
  return uVar8 ^ bVar2 == 0x21;
}

Assistant:

int Dau_DsdToGia_rec( Gia_Man_t * pGia, char * pStr, char ** p, int * pMatches, int * pLits, Vec_Int_t * vCover )
{
    int fCompl = 0;
    if ( **p == '!' )
        (*p)++, fCompl = 1;
    if ( **p >= 'a' && **p < 'a' + DAU_DSD_MAX_VAR ) // var
        return Abc_LitNotCond( pLits[**p - 'a'], fCompl );
    if ( **p == '(' ) // and/or
    {
        char * q = pStr + pMatches[ *p - pStr ];
        int pFans[DAU_DSD_MAX_VAR], nFans = 0, Fan;
        assert( **p == '(' && *q == ')' );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Fan = Dau_DsdToGia_rec( pGia, pStr, p, pMatches, pLits, vCover );
            Dau_DsdAddToArray( pGia, pFans, nFans++, Fan );
        }
        Fan = Dau_DsdBalance( pGia, pFans, nFans, 1 );
        assert( *p == q );
        return Abc_LitNotCond( Fan, fCompl );
    }
    if ( **p == '[' ) // xor
    {
        char * q = pStr + pMatches[ *p - pStr ];
        int pFans[DAU_DSD_MAX_VAR], nFans = 0, Fan;
        assert( **p == '[' && *q == ']' );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Fan = Dau_DsdToGia_rec( pGia, pStr, p, pMatches, pLits, vCover );
            Dau_DsdAddToArray( pGia, pFans, nFans++, Fan );
        }
        Fan = Dau_DsdBalance( pGia, pFans, nFans, 0 );
        assert( *p == q );
        return Abc_LitNotCond( Fan, fCompl );
    }
    if ( **p == '<' ) // mux
    {
        Gia_Obj_t * pObj;
        int nVars = 0;
        int Temp[3], * pTemp = Temp, Res;
        int Fanins[DAU_DSD_MAX_VAR], * pLits2;
        char * pOld = *p;
        char * q = pStr + pMatches[ *p - pStr ];
        // read fanins
        if ( *(q+1) == '{' )
        {
            char * q2;
            *p = q+1;
            q2 = pStr + pMatches[ *p - pStr ];
            assert( **p == '{' && *q2 == '}' );
            for ( nVars = 0, (*p)++; *p < q2; (*p)++, nVars++ )
                Fanins[nVars] = Dau_DsdToGia_rec( pGia, pStr, p, pMatches, pLits, vCover );
            assert( *p == q2 );
            pLits2 = Fanins;
        }
        else
            pLits2 = pLits;
        // read MUX
        *p = pOld;
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '<' && *q == '>' );
        // verify internal variables
        if ( nVars )
            for ( ; pOld < q; pOld++ )
                if ( *pOld >= 'a' && *pOld <= 'z' )
                    assert( *pOld - 'a' < nVars );
        // derive MUX components
        for ( (*p)++; *p < q; (*p)++ )
            *pTemp++ = Dau_DsdToGia_rec( pGia, pStr, p, pMatches, pLits2, vCover );
        assert( pTemp == Temp + 3 );
        assert( *p == q );
        if ( *(q+1) == '{' ) // and/or
        {
            char * q = pStr + pMatches[ ++(*p) - pStr ];
            assert( **p == '{' && *q == '}' );
            *p = q;
        }
        if ( pGia->pMuxes )
            Res = Gia_ManHashMuxReal( pGia, Temp[0], Temp[1], Temp[2] );
        else
            Res = Gia_ManHashMux( pGia, Temp[0], Temp[1], Temp[2] );
        pObj = Gia_ManObj(pGia, Abc_Lit2Var(Res));
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( pGia->pMuxes )
                Gia_ObjSetMuxLevel( pGia, pObj );
            else 
            {
                if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) )
                    Gia_ObjSetAndLevel( pGia, Gia_ObjFanin0(pObj) );
                if ( Gia_ObjIsAnd(Gia_ObjFanin1(pObj)) )
                    Gia_ObjSetAndLevel( pGia, Gia_ObjFanin1(pObj) );
                Gia_ObjSetAndLevel( pGia, pObj );
            }
        }
        return Abc_LitNotCond( Res, fCompl );
    }
    if ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
    {
        Vec_Int_t vLeaves;  char * q;
        word pFunc[DAU_DSD_MAX_VAR > 6 ? (1 << (DAU_DSD_MAX_VAR-6)) : 1];
        int Fanins[DAU_DSD_MAX_VAR], Res, nObjOld; 
        int i, nVars = Abc_TtReadHex( pFunc, *p );
        *p += Abc_TtHexDigitNum( nVars );
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '{' && *q == '}' );
        for ( i = 0, (*p)++; *p < q; (*p)++, i++ )
            Fanins[i] = Dau_DsdToGia_rec( pGia, pStr, p, pMatches, pLits, vCover );
        assert( i == nVars );
        assert( *p == q );
        vLeaves.nCap = nVars;
        vLeaves.nSize = nVars;
        vLeaves.pArray = Fanins;      
        nObjOld = Gia_ManObjNum(pGia);
        Res = Kit_TruthToGia( pGia, (unsigned *)pFunc, nVars, vCover, &vLeaves, 1 );
//        assert( nVars <= 6 );
//        Res = Dau_DsdToGiaCompose_rec( pGia, pFunc[0], Fanins, nVars );
        for ( i = nObjOld; i < Gia_ManObjNum(pGia); i++ )
            Gia_ObjSetGateLevel( pGia, Gia_ManObj(pGia, i) );
        m_Non1Step++;
        return Abc_LitNotCond( Res, fCompl );
    }
    assert( 0 );
    return 0;
}